

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O1

ostream * setup::operator<<(ostream *os,windows_version *version)

{
  undefined8 in_RAX;
  char *__s;
  char *__s_00;
  size_t sVar1;
  ostream *poVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  operator<<(os,&version->win_version);
  if ((((version->nt_version).build != (version->win_version).build) ||
      ((version->nt_version).major != (version->win_version).major)) ||
     ((version->nt_version).minor != (version->win_version).minor)) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  nt ",5);
    operator<<(os,&version->nt_version);
  }
  __s = anon_unknown_2::get_version_name(&version->win_version,false);
  __s_00 = anon_unknown_2::get_version_name(&version->nt_version,true);
  if (__s != (char *)0x0 || __s_00 != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    if (__s != (char *)0x0) {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
    }
    if (__s_00 != __s && __s_00 != (char *)0x0) {
      if (__s != (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(os," / ",3);
      }
      sVar1 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s_00,sVar1);
    }
    uStack_28._0_7_ = CONCAT16(0x29,(undefined6)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_28 + 6),1);
  }
  if ((version->nt_service_pack).minor != 0 || (version->nt_service_pack).major != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," service pack ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    if ((version->nt_service_pack).minor != 0) {
      uStack_28 = CONCAT17(0x2e,(undefined7)uStack_28);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)((long)&uStack_28 + 7),1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
  }
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const windows_version & version) {
	
	os << version.win_version;
	if(version.nt_version != version.win_version) {
		os << "  nt " << version.nt_version;
	}
	
	const char * win_name = get_version_name(version.win_version);
	const char * nt_name = get_version_name(version.nt_version, true);
	
	if(win_name || nt_name) {
		os << " (";
		if(win_name) {
			os << win_name;
		}
		if(nt_name && nt_name != win_name) {
			if(win_name) {
				os << " / ";
			}
			os << nt_name;
		}
		os << ')';
	}
	
	if(version.nt_service_pack.major || version.nt_service_pack.minor) {
		os << " service pack " << version.nt_service_pack.major;
		if(version.nt_service_pack.minor) {
			os << '.' << version.nt_service_pack.minor;
		}
	}
	
	return os;
}